

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserScannerInterface.cpp
# Opt level: O1

Node * Lodtalk::AST::parseDoItFromFile(VMContext *context,FILE *input)

{
  int iVar1;
  Node *pNVar2;
  yyscan_t scanner;
  ParserScannerExtraData extraData;
  yyscan_t local_40;
  ParserScannerExtraData local_38;
  
  iVar1 = Lodtalk_lex_init(&local_40);
  if (iVar1 == 0) {
    local_38.columnCount = 0;
    local_38._12_4_ = 0;
    local_38.astResult = (Node *)0x0;
    local_38.startToken = 0x118;
    local_38.errorCount = 0;
    local_38.context = context;
    Lodtalk_set_extra(&local_38,local_40);
    Lodtalk_set_in(input,local_40);
    pNVar2 = doParse(local_40,&local_38);
  }
  else {
    pNVar2 = (Node *)0x0;
  }
  return pNVar2;
}

Assistant:

Node *parseDoItFromFile(VMContext *context, FILE *input)
{
    yyscan_t scanner;
    if(Lodtalk_lex_init(&scanner))
        return nullptr;

    ParserScannerExtraData extraData;
    memset(&extraData, 0, sizeof(extraData));
    extraData.startToken = DO_IT;
    extraData.context = context;
    Lodtalk_set_extra(&extraData, scanner);
    Lodtalk_set_in(input, scanner);
	return doParse(scanner, &extraData);
}